

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_move(Tree *this,Tree *that)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long *in_RSI;
  long *in_RDI;
  size_t i;
  char msg_2 [33];
  char msg_1 [39];
  char msg [33];
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  pfn_allocate in_stack_fffffffffffffeb8;
  Location *in_stack_fffffffffffffec0;
  Location *this_00;
  Tree *in_stack_fffffffffffffed0;
  ulong local_108;
  Location local_d8;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  pfn_allocate local_90;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  pfn_allocate local_40;
  long *local_10;
  
  local_10 = in_RSI;
  if (*in_RDI != 0) {
    memcpy(&stack0xffffffffffffffc8,"check failed: (m_buf == nullptr)",0x21);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    Location::Location(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    (*pcVar1)(&stack0xffffffffffffffc8,0x21,in_RDI[8]);
    in_stack_fffffffffffffea0 = uStack_58;
    in_stack_fffffffffffffea4 = uStack_54;
    in_stack_fffffffffffffea8 = local_50;
    in_stack_fffffffffffffeac = uStack_4c;
    in_stack_fffffffffffffeb0 = uStack_48;
    in_stack_fffffffffffffeb4 = uStack_44;
    in_stack_fffffffffffffeb8 = local_40;
  }
  if (in_RDI[5] != 0) {
    memcpy(&stack0xffffffffffffff78,"check failed: (m_arena.str == nullptr)",0x27);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    in_stack_fffffffffffffed0 = (Tree *)&stack0xffffffffffffff78;
    Location::Location(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    (*pcVar1)(in_stack_fffffffffffffed0,0x27,in_RDI[8]);
    in_stack_fffffffffffffea0 = uStack_a8;
    in_stack_fffffffffffffea4 = uStack_a4;
    in_stack_fffffffffffffea8 = local_a0;
    in_stack_fffffffffffffeac = uStack_9c;
    in_stack_fffffffffffffeb0 = uStack_98;
    in_stack_fffffffffffffeb4 = uStack_94;
    in_stack_fffffffffffffeb8 = local_90;
  }
  if (in_RDI[6] != 0) {
    memcpy(&local_d8,"check failed: (m_arena.len == 0)",0x21);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    this_00 = &local_d8;
    Location::Location(this_00,(char *)in_stack_fffffffffffffeb8,
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    (*pcVar1)(this_00,0x21,in_RDI[8]);
  }
  *in_RDI = *local_10;
  in_RDI[1] = local_10[1];
  in_RDI[2] = local_10[2];
  in_RDI[3] = local_10[3];
  in_RDI[4] = local_10[4];
  in_RDI[5] = local_10[5];
  in_RDI[6] = local_10[6];
  in_RDI[7] = local_10[7];
  for (local_108 = 0; local_108 < 4; local_108 = local_108 + 1) {
    memcpy(in_RDI + local_108 * 5 + 0xc,local_10 + local_108 * 5 + 0xc,0x28);
  }
  _clear(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void Tree::_move(Tree & that)
{
    _RYML_CB_ASSERT(m_callbacks, m_buf == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.str == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.len == 0);
    m_buf = that.m_buf;
    m_cap = that.m_cap;
    m_size = that.m_size;
    m_free_head = that.m_free_head;
    m_free_tail = that.m_free_tail;
    m_arena = that.m_arena;
    m_arena_pos = that.m_arena_pos;
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = that.m_tag_directives[i];
    that._clear();
}